

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O2

void TPZShapeH1<pzshape::TPZShapeQuad>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  TPZFNMatrix<180,_double> *dphi;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  TPZTransform<double> *this;
  int nod;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong row;
  TPZFNMatrix<60,_double> *phi;
  int d;
  long lVar11;
  long lVar12;
  int side;
  double local_1240;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<18,_double> phiblend;
  TPZFNMatrix<18,_double> dphiblend;
  TPZFNMatrix<1,_double> auxmat;
  TPZFNMatrix<100,_double> phin;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<100,_double> dphiaux2;
  
  phi = &data->fPhi;
  dphi = &data->fDPhi;
  pzshape::TPZShapeQuad::ShapeCorner
            (pt,&phi->super_TPZFMatrix<double>,&dphi->super_TPZFMatrix<double>);
  if ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 4) {
    TPZFNMatrix<18,_double>::TPZFNMatrix(&phiblend,9,1);
    TPZFNMatrix<18,_double>::TPZFNMatrix(&dphiblend,2,9);
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      pdVar7 = TPZFMatrix<double>::operator()(&phi->super_TPZFMatrix<double>,lVar8,0);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar8,0);
      *pdVar7 = dVar1;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()(&dphi->super_TPZFMatrix<double>,lVar11,lVar8);
        dVar1 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar11,lVar8);
        *pdVar7 = dVar1;
      }
    }
    pzshape::TPZShapeQuad::ShapeGenerating
              (pt,&phiblend.super_TPZFMatrix<double>,&dphiblend.super_TPZFMatrix<double>);
    row = 4;
    for (lVar8 = 4; lVar8 != 9; lVar8 = lVar8 + 1) {
      side = (int)lVar8;
      iVar5 = pzshape::TPZShapeQuad::NConnectShapeF
                        (side,(data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar8 + -4]);
      if (iVar5 != 0) {
        pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar8,0);
        dVar1 = *pdVar7;
        iVar6 = (int)row;
        pdVar7 = TPZFMatrix<double>::operator()(&phi->super_TPZFMatrix<double>,(long)iVar6,0);
        *pdVar7 = dVar1;
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar11,lVar8);
          dVar1 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&dphi->super_TPZFMatrix<double>,lVar11,(long)iVar6);
          *pdVar7 = dVar1;
        }
        uVar10 = iVar6 + 1;
        row = (ulong)uVar10;
        if (iVar5 != 1) {
          this = (data->fSideTransforms).super_TPZVec<TPZTransform<double>_>.fStore + lVar8 + -4;
          iVar6 = pztopology::TPZQuadrilateral::SideDimension(side);
          lVar11 = (long)iVar5;
          TPZFNMatrix<100,_double>::TPZFNMatrix(&phin,lVar11,1);
          TPZFNMatrix<100,_double>::TPZFNMatrix(&dphin,(long)iVar6,lVar11);
          TPZFNMatrix<100,_double>::TPZFNMatrix(&dphiaux,2,lVar11);
          TPZFNMatrix<100,_double>::TPZFNMatrix(&dphiaux2,2,lVar11);
          TPZManVector<double,_3>::TPZManVector(&outvec,(long)iVar6);
          TPZTransform<double>::Apply(this,pt,&outvec.super_TPZVec<double>);
          pzshape::TPZShapeQuad::ShapeInternal
                    (side,&outvec.super_TPZVec<double>,
                     (data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar8 + -4],
                     &phin.super_TPZFMatrix<double>,&dphin.super_TPZFMatrix<double>);
          if (iVar6 < 3) {
            local_1240 = 0.0;
            TPZFNMatrix<1,_double>::TPZFNMatrix(&auxmat,1,1,&local_1240);
            (*(this->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x27])
                      (0x3ff0000000000000,0,&this->fMult,&dphin,&auxmat,&dphiaux,1);
            row = (ulong)(int)uVar10;
            for (lVar12 = 1; lVar12 < lVar11; lVar12 = lVar12 + 1) {
              pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar8,0);
              dVar1 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,lVar12,0);
              dVar2 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()(&phi->super_TPZFMatrix<double>,row,0);
              *pdVar7 = dVar1 * dVar2;
              for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
                pdVar7 = TPZFMatrix<double>::operator()
                                   (&dphiblend.super_TPZFMatrix<double>,lVar9,lVar8);
                dVar1 = *pdVar7;
                pdVar7 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,lVar12,0);
                dVar2 = *pdVar7;
                pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar8,0);
                dVar3 = *pdVar7;
                pdVar7 = TPZFMatrix<double>::operator()
                                   (&dphiaux.super_TPZFMatrix<double>,lVar9,lVar12);
                dVar4 = *pdVar7;
                pdVar7 = TPZFMatrix<double>::operator()(&dphi->super_TPZFMatrix<double>,lVar9,row);
                *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
              }
              row = row + 1;
            }
            TPZFNMatrix<1,_double>::~TPZFNMatrix(&auxmat);
          }
          else {
            row = (ulong)(int)uVar10;
            for (lVar12 = 1; lVar12 < lVar11; lVar12 = lVar12 + 1) {
              pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar8,0);
              dVar1 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,lVar12,0);
              dVar2 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()(&phi->super_TPZFMatrix<double>,row,0);
              *pdVar7 = dVar1 * dVar2;
              for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
                pdVar7 = TPZFMatrix<double>::operator()
                                   (&dphiblend.super_TPZFMatrix<double>,lVar9,lVar8);
                dVar1 = *pdVar7;
                pdVar7 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,lVar12,0);
                dVar2 = *pdVar7;
                pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar8,0);
                dVar3 = *pdVar7;
                pdVar7 = TPZFMatrix<double>::operator()
                                   (&dphin.super_TPZFMatrix<double>,lVar9,lVar12);
                dVar4 = *pdVar7;
                pdVar7 = TPZFMatrix<double>::operator()(&dphi->super_TPZFMatrix<double>,lVar9,row);
                *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
              }
              row = row + 1;
            }
          }
          TPZManVector<double,_3>::~TPZManVector(&outvec);
          TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphiaux2);
          TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphiaux);
          TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphin);
          TPZFNMatrix<100,_double>::~TPZFNMatrix(&phin);
        }
      }
    }
    TPZFNMatrix<18,_double>::~TPZFNMatrix(&dphiblend);
    TPZFNMatrix<18,_double>::~TPZFNMatrix(&phiblend);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}